

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

VariableDimensionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VariableDimensionSyntax,slang::parsing::Token&,slang::syntax::DimensionSpecifierSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,DimensionSpecifierSyntax **args_1,Token *args_2)

{
  DimensionSpecifierSyntax *pDVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  VariableDimensionSyntax *pVVar12;
  
  pVVar12 = (VariableDimensionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariableDimensionSyntax *)this->endPtr < pVVar12 + 1) {
    pVVar12 = (VariableDimensionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pVVar12 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar2 = args->info;
  pDVar1 = *args_1;
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pVVar12->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pVVar12->super_SyntaxNode).kind = VariableDimension;
  (pVVar12->openBracket).kind = TVar4;
  (pVVar12->openBracket).field_0x2 = uVar5;
  (pVVar12->openBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pVVar12->openBracket).rawLen = uVar7;
  (pVVar12->openBracket).info = pIVar2;
  pVVar12->specifier = pDVar1;
  (pVVar12->closeBracket).kind = TVar8;
  (pVVar12->closeBracket).field_0x2 = uVar9;
  (pVVar12->closeBracket).numFlags = (NumericTokenFlags)NVar10.raw;
  (pVVar12->closeBracket).rawLen = uVar11;
  (pVVar12->closeBracket).info = pIVar3;
  if (pDVar1 != (DimensionSpecifierSyntax *)0x0) {
    (pDVar1->super_SyntaxNode).parent = &pVVar12->super_SyntaxNode;
  }
  return pVVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }